

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

ConstantFoldingRule *
spvtools::opt::anon_unknown_0::FoldBinaryOp
          (ConstantFoldingRule *__return_storage_ptr__,BinaryScalarFoldingRule *scalar_rule)

{
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  local_38;
  BinaryScalarFoldingRule *local_18;
  BinaryScalarFoldingRule *scalar_rule_local;
  
  local_18 = scalar_rule;
  scalar_rule_local = (BinaryScalarFoldingRule *)__return_storage_ptr__;
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::function(&local_38,scalar_rule);
  std::
  function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
  ::
  function<spvtools::opt::(anonymous_namespace)::FoldBinaryOp(std::function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>)::__0,void>
            ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
              *)__return_storage_ptr__,(anon_class_32_1_40d62dcf *)&local_38);
  (anonymous_namespace)::
  FoldBinaryOp(std::function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>)
  ::$_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ConstantFoldingRule FoldBinaryOp(BinaryScalarFoldingRule scalar_rule) {
  return [scalar_rule](IRContext* context, Instruction* inst,
                       const std::vector<const analysis::Constant*>& constants)
             -> const analysis::Constant* {
    assert(constants.size() == inst->NumInOperands());
    assert(constants.size() == (inst->opcode() == spv::Op::OpExtInst ? 3 : 2));
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();
    const analysis::Type* result_type = type_mgr->GetType(inst->type_id());
    const analysis::Vector* vector_type = result_type->AsVector();

    const analysis::Constant* arg1 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[1] : constants[0];
    const analysis::Constant* arg2 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[2] : constants[1];

    if (arg1 == nullptr || arg2 == nullptr) {
      return nullptr;
    }

    if (vector_type == nullptr) {
      return scalar_rule(result_type, arg1, arg2, const_mgr);
    }

    std::vector<const analysis::Constant*> a_components;
    std::vector<const analysis::Constant*> b_components;
    std::vector<const analysis::Constant*> results_components;

    a_components = arg1->GetVectorComponents(const_mgr);
    b_components = arg2->GetVectorComponents(const_mgr);
    assert(a_components.size() == b_components.size());

    // Fold each component of the vector.
    for (uint32_t i = 0; i < a_components.size(); ++i) {
      results_components.push_back(scalar_rule(vector_type->element_type(),
                                               a_components[i], b_components[i],
                                               const_mgr));
      if (results_components[i] == nullptr) {
        return nullptr;
      }
    }

    // Build the constant object and return it.
    std::vector<uint32_t> ids;
    for (const analysis::Constant* member : results_components) {
      ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
    }
    return const_mgr->GetConstant(vector_type, ids);
  };
}